

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O3

void __thiscall
glcts::TessellationShaderTCTEgl_TessLevel::initTestDescriptor
          (TessellationShaderTCTEgl_TessLevel *this,_tessellation_test_type test_type,
          _test_descriptor *out_test_ptr,_tessellation_shader_vertex_spacing vertex_spacing_mode)

{
  undefined4 uVar1;
  undefined4 uVar2;
  char *__s;
  char *pcVar3;
  _test_descriptor *p_Var4;
  int iVar5;
  GLuint GVar6;
  deUint32 dVar7;
  GLint GVar8;
  undefined4 extraout_var;
  ulong uVar10;
  TestError *this_00;
  _tessellation_shader_vertex_spacing vertex_spacing;
  long lVar11;
  string te_body_string;
  char *vs_body;
  GLint link_status;
  char *tc_body;
  char *te_body_string_raw;
  char *fs_body;
  char *varyings [2];
  undefined8 local_258;
  undefined4 uStack_250;
  GLuint GStack_24c;
  undefined1 local_248;
  undefined7 uStack_247;
  long *local_238;
  char *local_230;
  long local_228 [2];
  TessellationShaderTCTEgl_TessLevel *local_218;
  string local_210;
  _test_descriptor *local_1f0;
  char *local_1e8;
  long *local_1e0 [2];
  long local_1d0 [2];
  char *local_1c0;
  undefined1 local_1b8 [8];
  undefined4 uStack_1b0;
  undefined4 uStack_1ac;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  long lVar9;
  
  out_test_ptr->type = test_type;
  out_test_ptr->vertex_spacing = vertex_spacing_mode;
  iVar5 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar5);
  GVar6 = (**(code **)(lVar9 + 0x3c8))();
  out_test_ptr->po_id = GVar6;
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glCreateProgram() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xd02);
  GVar6 = (**(code **)(lVar9 + 0x3f0))(0x8b30);
  out_test_ptr->fs_id = GVar6;
  GVar6 = (**(code **)(lVar9 + 0x3f0))(0x8b31);
  out_test_ptr->vs_id = GVar6;
  if (test_type < TESSELLATION_TEST_TYPE_COUNT) {
    GVar6 = (**(code **)(lVar9 + 0x3f0))
                      ((this->super_TestCaseBase).m_glExtTokens.TESS_EVALUATION_SHADER);
    out_test_ptr->tes_id = GVar6;
    if (test_type == TESSELLATION_TEST_TYPE_FIRST) {
      GVar6 = (**(code **)(lVar9 + 0x3f0))
                        ((this->super_TestCaseBase).m_glExtTokens.TESS_CONTROL_SHADER);
      out_test_ptr->tcs_id = GVar6;
    }
  }
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glCreateShader() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xd12);
  local_1c0 = "${VERSION}\n\nvoid main()\n{\n}\n";
  TestCaseBase::shaderSourceSpecialized(&this->super_TestCaseBase,out_test_ptr->fs_id,1,&local_1c0);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glShaderSource() failed for fragment shader object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xd1c);
  local_1e8 = 
  "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = 4) out;\n\nuniform vec2 inner_tess_levels;\nuniform vec4 outer_tess_levels;\n\nvoid main()\n{\n    gl_out           [gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n    gl_TessLevelInner[0]                           = inner_tess_levels[0];\n    gl_TessLevelInner[1]                           = inner_tess_levels[1];\n    gl_TessLevelOuter[0]                           = outer_tess_levels[0];\n    gl_TessLevelOuter[1]                           = outer_tess_levels[1];\n    gl_TessLevelOuter[2]                           = outer_tess_levels[2];\n    gl_TessLevelOuter[3]                           = outer_tess_levels[3];\n}\n"
  ;
  local_218 = this;
  if (test_type == TESSELLATION_TEST_TYPE_FIRST) {
    TestCaseBase::shaderSourceSpecialized
              (&this->super_TestCaseBase,out_test_ptr->tcs_id,1,&local_1e8);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"glShaderSource() failed for tessellation control shader object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xd37);
  }
  else if (TESSELLATION_TEST_TYPE_TES < test_type) goto LAB_00d454ec;
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  local_258 = (long *)&local_248;
  uStack_250 = 0;
  GStack_24c = 0;
  local_248 = 0;
  local_238 = local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"VERTEX_SPACING_MODE","");
  TessellationShaderUtils::getESTokenForVertexSpacingMode_abi_cxx11_
            (&local_210,(TessellationShaderUtils *)(ulong)vertex_spacing_mode,vertex_spacing);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,
             "${VERSION}\n\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (isolines, point_mode, VERTEX_SPACING_MODE) in;\n\nout vec2 result_tess_level_inner;\nout vec4 result_tess_level_outer;\n\nvoid main()\n{\n    gl_Position = gl_in[0].gl_Position;\n\n    result_tess_level_inner = vec2(gl_TessLevelInner[0],\n                                   gl_TessLevelInner[1]);\n    result_tess_level_outer = vec4(gl_TessLevelOuter[0],\n                                   gl_TessLevelOuter[1],\n                                   gl_TessLevelOuter[2],\n                                   gl_TessLevelOuter[3]);\n}\n"
             ,0x23a);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_258,(string *)local_1e0);
  if (local_1e0[0] != local_1d0) {
    operator_delete(local_1e0[0],local_1d0[0] + 1);
  }
  uVar10 = std::__cxx11::string::find((char *)&local_258,(ulong)local_238,0);
  pcVar3 = local_230;
  this = local_218;
  local_1e0[0] = local_258;
  while (local_218 = this, local_258 = local_1e0[0], uVar10 != 0xffffffffffffffff) {
    __s = (char *)CONCAT44(local_210._M_dataplus._M_p._4_4_,(int)local_210._M_dataplus._M_p);
    local_230 = pcVar3;
    strlen(__s);
    std::__cxx11::string::replace((ulong)&local_258,uVar10,pcVar3,(ulong)__s);
    std::__cxx11::string::_M_assign((string *)&local_258);
    uVar10 = std::__cxx11::string::find((char *)&local_258,(ulong)local_238,0);
    pcVar3 = local_230;
    this = local_218;
    local_1e0[0] = local_258;
  }
  TestCaseBase::shaderSourceSpecialized
            (&this->super_TestCaseBase,out_test_ptr->tes_id,1,(GLchar **)local_1e0);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glShaderSource() failed for tessellation evaluation shader object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xd6a);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_210._M_dataplus._M_p._4_4_,(int)local_210._M_dataplus._M_p) !=
      &local_210.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_210._M_dataplus._M_p._4_4_,(int)local_210._M_dataplus._M_p),
                    local_210.field_2._M_allocated_capacity + 1);
  }
  if (local_238 != local_228) {
    operator_delete(local_238,local_228[0] + 1);
  }
  if (local_258 != (long *)&local_248) {
    operator_delete(local_258,CONCAT71(uStack_247,local_248) + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
LAB_00d454ec:
  local_238 = (long *)0x1b6dd2d;
  TestCaseBase::shaderSourceSpecialized
            (&this->super_TestCaseBase,out_test_ptr->vs_id,1,(GLchar **)&local_238);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glShaderSource() failed for vertex shader object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xd76);
  local_258._0_4_ = out_test_ptr->fs_id;
  uVar1 = out_test_ptr->tcs_id;
  uVar2 = out_test_ptr->tes_id;
  local_258._4_4_ = uVar1;
  uStack_250 = uVar2;
  GStack_24c = out_test_ptr->vs_id;
  lVar11 = 0;
  local_1f0 = out_test_ptr;
  do {
    local_210._M_dataplus._M_p._0_4_ = 0;
    iVar5 = *(int *)((long)&local_258 + lVar11 * 4);
    if (iVar5 != 0) {
      (**(code **)(lVar9 + 0x248))(iVar5);
      dVar7 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar7,"glCompileShader() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0xd85);
      (**(code **)(lVar9 + 0xa70))(iVar5,0x8b81,&local_210);
      dVar7 = (**(code **)(lVar9 + 0x800))();
      glu::checkError(dVar7,"glGetShaderiv() call failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0xd88);
      if ((int)local_210._M_dataplus._M_p != 1) {
        local_1b8 = (undefined1  [8])
                    ((local_218->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log
        ;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&uStack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&uStack_1b0,"Compilation of shader object at index ",0x26);
        std::ostream::_M_insert<unsigned_long>((ulong)&uStack_1b0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&uStack_1b0," failed.",8);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&uStack_1b0);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x68));
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,"Shader compilation failed",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                   ,0xd8f);
        goto LAB_00d45832;
      }
    }
    p_Var4 = local_1f0;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 4);
  local_210._M_dataplus._M_p._0_4_ = 0;
  local_1b8 = (undefined1  [8])0x1b6dd76;
  uStack_1b0 = 0x1b6dd8e;
  uStack_1ac = 0;
  (**(code **)(lVar9 + 0x14c8))(local_1f0->po_id,2,local_1b8,0x8c8c);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glTransformFeedbackVaryings() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xd9a);
  (**(code **)(lVar9 + 0x10))(p_Var4->po_id,p_Var4->fs_id);
  (**(code **)(lVar9 + 0x10))(p_Var4->po_id,p_Var4->vs_id);
  if (p_Var4->tcs_id != 0) {
    (**(code **)(lVar9 + 0x10))(p_Var4->po_id);
  }
  if (p_Var4->tes_id != 0) {
    (**(code **)(lVar9 + 0x10))(p_Var4->po_id);
  }
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glAttachShader() call(s) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xda9);
  (**(code **)(lVar9 + 0xce8))(p_Var4->po_id);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glLinkProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xdac);
  (**(code **)(lVar9 + 0x9d8))(p_Var4->po_id,0x8b82,&local_210);
  dVar7 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar7,"glGetProgramiv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0xdaf);
  if ((int)local_210._M_dataplus._M_p == 1) {
    GVar8 = (**(code **)(lVar9 + 0xb48))(p_Var4->po_id,"inner_tess_levels");
    p_Var4->inner_tess_levels_uniform_location = GVar8;
    GVar8 = (**(code **)(lVar9 + 0xb48))(p_Var4->po_id,"outer_tess_levels");
    p_Var4->outer_tess_levels_uniform_location = GVar8;
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"glGetUniformLocation() call(s) failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                    ,0xdba);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Program linking failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
             ,0xdb3);
LAB_00d45832:
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void TessellationShaderTCTEgl_TessLevel::initTestDescriptor(_tessellation_test_type				test_type,
															_test_descriptor*					out_test_ptr,
															_tessellation_shader_vertex_spacing vertex_spacing_mode)
{
	out_test_ptr->type			 = test_type;
	out_test_ptr->vertex_spacing = vertex_spacing_mode;

	/* Generate a program object we will later configure */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	out_test_ptr->po_id = gl.createProgram();

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateProgram() failed");

	/* Generate shader objects the test will use */
	out_test_ptr->fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	out_test_ptr->vs_id = gl.createShader(GL_VERTEX_SHADER);

	if (test_type == TESSELLATION_TEST_TYPE_TCS_TES || test_type == TESSELLATION_TEST_TYPE_TES)
	{
		out_test_ptr->tes_id = gl.createShader(m_glExtTokens.TESS_EVALUATION_SHADER);
	}

	if (test_type == TESSELLATION_TEST_TYPE_TCS_TES)
	{
		out_test_ptr->tcs_id = gl.createShader(m_glExtTokens.TESS_CONTROL_SHADER);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() failed");

	/* Configure fragment shader */
	const char* fs_body = "${VERSION}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "}\n";

	shaderSourceSpecialized(out_test_ptr->fs_id, 1 /* count */, &fs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for fragment shader object");

	/* Configure tessellation control shader */
	const char* tc_body = "${VERSION}\n"
						  "\n"
						  /* Required EXT_tessellation_shader functionality */
						  "${TESSELLATION_SHADER_REQUIRE}\n"
						  "\n"
						  "layout (vertices = 4) out;\n"
						  "\n"
						  "uniform vec2 inner_tess_levels;\n"
						  "uniform vec4 outer_tess_levels;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    gl_out           [gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
						  "    gl_TessLevelInner[0]                           = inner_tess_levels[0];\n"
						  "    gl_TessLevelInner[1]                           = inner_tess_levels[1];\n"
						  "    gl_TessLevelOuter[0]                           = outer_tess_levels[0];\n"
						  "    gl_TessLevelOuter[1]                           = outer_tess_levels[1];\n"
						  "    gl_TessLevelOuter[2]                           = outer_tess_levels[2];\n"
						  "    gl_TessLevelOuter[3]                           = outer_tess_levels[3];\n"
						  "}\n";

	if (test_type == TESSELLATION_TEST_TYPE_TCS_TES)
	{
		shaderSourceSpecialized(out_test_ptr->tcs_id, 1 /* count */, &tc_body);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for tessellation control shader object");
	}

	/* Configure tessellation evaluation shader */
	const char* te_body = "${VERSION}\n"
						  "\n"
						  "${TESSELLATION_SHADER_REQUIRE}\n"
						  "\n"
						  "layout (isolines, point_mode, VERTEX_SPACING_MODE) in;\n"
						  "\n"
						  "out vec2 result_tess_level_inner;\n"
						  "out vec4 result_tess_level_outer;\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    gl_Position = gl_in[0].gl_Position;\n"
						  "\n"
						  "    result_tess_level_inner = vec2(gl_TessLevelInner[0],\n"
						  "                                   gl_TessLevelInner[1]);\n"
						  "    result_tess_level_outer = vec4(gl_TessLevelOuter[0],\n"
						  "                                   gl_TessLevelOuter[1],\n"
						  "                                   gl_TessLevelOuter[2],\n"
						  "                                   gl_TessLevelOuter[3]);\n"
						  "}\n";

	if (test_type == TESSELLATION_TEST_TYPE_TCS_TES || test_type == TESSELLATION_TEST_TYPE_TES)
	{
		/* Replace VERTEX_SPACING_MODE with the mode provided by the caller */
		std::stringstream te_body_stringstream;
		std::string		  te_body_string;
		const std::string token = "VERTEX_SPACING_MODE";
		std::size_t		  token_index;
		std::string		  vertex_spacing_string =
			TessellationShaderUtils::getESTokenForVertexSpacingMode(vertex_spacing_mode);

		te_body_stringstream << te_body;
		te_body_string = te_body_stringstream.str();

		token_index = te_body_string.find(token);

		while (token_index != std::string::npos)
		{
			te_body_string = te_body_string.replace(token_index, token.length(), vertex_spacing_string.c_str());

			token_index = te_body_string.find(token);
		}

		/* Set the shader source */
		const char* te_body_string_raw = te_body_string.c_str();

		shaderSourceSpecialized(out_test_ptr->tes_id, 1 /* count */, &te_body_string_raw);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for tessellation evaluation shader object");
	}

	/* Configure vertex shader */
	const char* vs_body = "${VERSION}\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "    gl_Position = vec4(1.0, 2.0, 3.0, 4.0);\n"
						  "}\n";

	shaderSourceSpecialized(out_test_ptr->vs_id, 1 /* count */, &vs_body);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed for vertex shader object");

	/* Compile all shaders of our interest */
	const glw::GLuint shaders[] = { out_test_ptr->fs_id, out_test_ptr->tcs_id, out_test_ptr->tes_id,
									out_test_ptr->vs_id };
	const unsigned int n_shaders = sizeof(shaders) / sizeof(shaders[0]);

	for (unsigned int n_shader = 0; n_shader < n_shaders; ++n_shader)
	{
		glw::GLint  compile_status = GL_FALSE;
		glw::GLuint shader		   = shaders[n_shader];

		if (shader != 0)
		{
			gl.compileShader(shader);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed");

			gl.getShaderiv(shader, GL_COMPILE_STATUS, &compile_status);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed");

			if (compile_status != GL_TRUE)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Compilation of shader object at index " << n_shader
								   << " failed." << tcu::TestLog::EndMessage;

				TCU_FAIL("Shader compilation failed");
			}
		} /* if (shader != 0) */
	}	 /* for (all shaders) */

	/* Attach the shaders to the test program object, set up XFB and then link the program */
	glw::GLint		   link_status = GL_FALSE;
	const char*		   varyings[]  = { "result_tess_level_inner", "result_tess_level_outer" };
	const unsigned int n_varyings  = sizeof(varyings) / sizeof(varyings[0]);

	gl.transformFeedbackVaryings(out_test_ptr->po_id, n_varyings, varyings, GL_INTERLEAVED_ATTRIBS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTransformFeedbackVaryings() call failed");

	gl.attachShader(out_test_ptr->po_id, out_test_ptr->fs_id);
	gl.attachShader(out_test_ptr->po_id, out_test_ptr->vs_id);

	if (out_test_ptr->tcs_id != 0)
	{
		gl.attachShader(out_test_ptr->po_id, out_test_ptr->tcs_id);
	}

	if (out_test_ptr->tes_id != 0)
	{
		gl.attachShader(out_test_ptr->po_id, out_test_ptr->tes_id);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader() call(s) failed.");

	gl.linkProgram(out_test_ptr->po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() call failed.");

	gl.getProgramiv(out_test_ptr->po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() call failed.");

	if (link_status != GL_TRUE)
	{
		TCU_FAIL("Program linking failed");
	}

	/* Retrieve uniform locations */
	out_test_ptr->inner_tess_levels_uniform_location = gl.getUniformLocation(out_test_ptr->po_id, "inner_tess_levels");
	out_test_ptr->outer_tess_levels_uniform_location = gl.getUniformLocation(out_test_ptr->po_id, "outer_tess_levels");

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformLocation() call(s) failed");

	if (test_type == TESSELLATION_TEST_TYPE_TCS_TES)
	{
		DE_ASSERT(out_test_ptr->inner_tess_levels_uniform_location != -1);
		DE_ASSERT(out_test_ptr->outer_tess_levels_uniform_location != -1);
	}
}